

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O1

int cuddHashTableInsert(DdHashTable *hash,DdNodePtr *key,DdNode *value,ptrint count)

{
  int *piVar1;
  uint uVar2;
  DdHashItem **ppDVar3;
  int iVar4;
  DdHashItem *pDVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  
  if (hash->maxsize < hash->size) {
    cuddHashTableResize(hash);
  }
  pDVar5 = cuddHashTableAlloc(hash);
  if (pDVar5 == (DdHashItem *)0x0) {
    iVar4 = 0;
  }
  else {
    hash->size = hash->size + 1;
    pDVar5->value = value;
    piVar1 = (int *)(((ulong)value & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar5->count = count;
    uVar2 = hash->keysize;
    uVar7 = (ulong)uVar2;
    if (uVar7 != 0) {
      uVar6 = 0;
      do {
        pDVar5->key[uVar6] = key[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
    uVar8 = *(int *)key * 0x40f1f9;
    if (1 < uVar2) {
      uVar6 = 1;
      do {
        uVar8 = uVar8 * 0xc00005 + *(int *)(key + uVar6);
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
    uVar8 = uVar8 >> ((byte)hash->shift & 0x1f);
    ppDVar3 = hash->bucket;
    pDVar5->next = ppDVar3[uVar8];
    ppDVar3[uVar8] = pDVar5;
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int
cuddHashTableInsert(
  DdHashTable * hash,
  DdNodePtr * key,
  DdNode * value,
  ptrint count)
{
    int result;
    unsigned int posn;
    DdHashItem *item;
    unsigned int i;

#ifdef DD_DEBUG
    assert(hash->keysize > 3);
#endif

    if (hash->size > hash->maxsize) {
        result = cuddHashTableResize(hash);
        if (result == 0) return(0);
    }
    item = cuddHashTableAlloc(hash);
    if (item == NULL) return(0);
    hash->size++;
    item->value = value;
    cuddRef(value);
    item->count = count;
    for (i = 0; i < hash->keysize; i++) {
        item->key[i] = key[i];
    }
    posn = ddLCHash(key,hash->keysize,hash->shift);
    item->next = hash->bucket[posn];
    hash->bucket[posn] = item;

    return(1);

}